

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_projection_blind_desc(parser *p)

{
  parser_error pVar1;
  char *pcVar2;
  void *pvVar3;
  
  pcVar2 = parser_getstr(p,"desc");
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    string_free(*(char **)((long)pvVar3 + 0x28));
    pcVar2 = string_make(pcVar2);
    *(char **)((long)pvVar3 + 0x28) = pcVar2;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_projection_blind_desc(struct parser *p) {
	const char *desc = parser_getstr(p, "desc");
	struct projection *projection = parser_priv(p);

	if (!projection) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	string_free(projection->blind_desc);
	projection->blind_desc = string_make(desc);
	return PARSE_ERROR_NONE;
}